

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O1

pboolean pp_uthread_get_unix_priority(PUThreadPriority prio,int *sched_policy,int *sched_priority)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (prio == P_UTHREAD_PRIORITY_IDLE) {
    *sched_policy = 5;
    iVar3 = 0;
  }
  else {
    iVar1 = sched_get_priority_min(*sched_policy);
    iVar2 = sched_get_priority_max(*sched_policy);
    if (iVar1 == -1) {
      return 0;
    }
    if (iVar2 == -1) {
      return 0;
    }
    iVar3 = (int)((iVar2 - iVar1) * (prio - P_UTHREAD_PRIORITY_LOWEST)) / 7 + iVar1;
    if (iVar2 < iVar3) {
      iVar3 = iVar2;
    }
    if (iVar3 < iVar1) {
      iVar3 = iVar1;
    }
  }
  *sched_priority = iVar3;
  return 1;
}

Assistant:

static pboolean
pp_uthread_get_unix_priority (PUThreadPriority	prio,
				  int		*sched_policy,
				  int		*sched_priority)
{
	pint lowBound;
	pint upperBound;
	pint prio_min;
	pint prio_max;
	pint native_prio;

#ifdef SCHED_IDLE
	if (prio == P_UTHREAD_PRIORITY_IDLE) {
		*sched_policy = SCHED_IDLE;
		*sched_priority = 0;
		return TRUE;
	}

	lowBound = (pint) P_UTHREAD_PRIORITY_LOWEST;
#else
	lowBound = (pint) P_UTHREAD_PRIORITY_IDLE;
#endif
	upperBound = (pint) P_UTHREAD_PRIORITY_TIMECRITICAL;

	prio_min = sched_get_priority_min (*sched_policy);
	prio_max = sched_get_priority_max (*sched_policy);

	if (P_UNLIKELY (prio_min == -1 || prio_max == -1))
		return FALSE;

	native_prio = ((pint) prio - lowBound) * (prio_max - prio_min) / upperBound + prio_min;

	if (P_UNLIKELY (native_prio > prio_max))
		native_prio = prio_max;

	if (P_UNLIKELY (native_prio < prio_min))
		native_prio = prio_min;

	*sched_priority = native_prio;

	return TRUE;
}